

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O2

Factor * __thiscall libDAI::MaxPlus::beliefF(Factor *__return_storage_ptr__,MaxPlus *this,size_t I)

{
  pointer pvVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  VarSet *ns;
  long *plVar5;
  size_t *psVar6;
  Prob prod;
  Prob prod_j;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x50))
                    ((long *)CONCAT44(extraout_var,iVar2),I);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,
             (vector<double,_std::allocator<double>_> *)(lVar3 + 0x20));
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  plVar5 = *(long **)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x88) + I * 0x18);
  while( true ) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    if (plVar5 == *(long **)(*(long *)(CONCAT44(extraout_var_01,iVar2) + 0x88) + 8 + I * 0x18))
    break;
    lVar3 = *(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[*plVar5].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data + I * 8);
    pvVar1 = (this->_indices).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x30))
                      ((long *)CONCAT44(extraout_var_02,iVar2),*plVar5);
    TProb<double>::TProb((TProb<double> *)&local_48,*(size_t *)(lVar4 + 8));
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    psVar6 = *(size_t **)(*(long *)(CONCAT44(extraout_var_03,iVar2) + 0x70) + *plVar5 * 0x18);
    while( true ) {
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      if (psVar6 == *(size_t **)
                     (*(long *)(CONCAT44(extraout_var_04,iVar2) + 0x70) + 8 + *plVar5 * 0x18))
      break;
      if (*psVar6 != I) {
        TProb<double>::operator*=
                  ((TProb<double> *)&local_48,
                   (this->_newmessages).
                   super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   *(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[*plVar5].
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data + *psVar6 * 8));
      }
      psVar6 = psVar6 + 1;
    }
    for (lVar4 = 0;
        (long)local_60._M_impl.super__Vector_impl_data._M_finish -
        (long)local_60._M_impl.super__Vector_impl_data._M_start >> 3 != lVar4; lVar4 = lVar4 + 1) {
      local_60._M_impl.super__Vector_impl_data._M_start[lVar4] =
           local_48._M_impl.super__Vector_impl_data._M_start
           [*(long *)(*(long *)&pvVar1[lVar3].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data + lVar4 * 8)] *
           local_60._M_impl.super__Vector_impl_data._M_start[lVar4];
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    plVar5 = plVar5 + 1;
  }
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  ns = (VarSet *)
       (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x50))
                 ((long *)CONCAT44(extraout_var_05,iVar2),I);
  TFactor<double>::TFactor(__return_storage_ptr__,ns,(TProb<double> *)&local_60);
  TProb<double>::normalize(&__return_storage_ptr__->_p,NORMPROB);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Factor MaxPlus::beliefF (size_t I) const {
        Prob prod( grm().factor(I).p() );

        for( FactorGraph::nb_cit j = grm().nbF(I).begin(); j != grm().nbF(I).end(); j++ ) {
            // ind is the precalculated Index(j,I) i.e. to x_I == k corresponds x_j == ind[k]
            const _ind_t *ind = &(index(*j, I));

            // prod_j will be the product of messages coming into j
            Prob prod_j( grm().var(*j).states() ); 
            for( FactorGraph::nb_cit J = grm().nbV(*j).begin(); J != grm().nbV(*j).end(); J++ ) 
                if( *J != I )   // for all J in nb(j) \ I 
                    prod_j *= newMessage(*j,*J);

            // multiply prod with prod_j
            for( size_t r = 0; r < prod.size(); r++ )
                prod[r] *= prod_j[(*ind)[r]];
        }

        Factor result( grm().factor(I).vars(), prod );
        result.normalize();
        
        return( result );

    /*  UNOPTIMIZED VERSION
     
        Factor prod( grm().factor(I) );
        for( FactorGraph::nb_cit i = grm().nbF(I).begin(); i != grm().nbF(I).end(); i++ ) {
            for( FactorGraph::nb_cit J = grm().nbV(*i).begin(); J != grm().nbV(*i).end(); J++ )
                if( *J != I )
                    prod *= Factor( grm().var(*i), newMessage(*i,*J)) );
        }
        return prod.normalized();*/
    }